

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<long_*> * __thiscall TPZVec<long_*>::operator=(TPZVec<long_*> *this,TPZVec<long_*> *copy)

{
  long lVar1;
  long lVar2;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this,copy->fNElements);
    lVar2 = 0;
    lVar1 = copy->fNElements;
    if (copy->fNElements < 1) {
      lVar1 = lVar2;
    }
    for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      this->fStore[lVar2] = copy->fStore[lVar2];
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}